

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall Constructor::addOperand(Constructor *this,OperandSymbol *sym)

{
  size_type sVar1;
  char *pcVar2;
  allocator local_39;
  string local_38 [8];
  string operstring;
  OperandSymbol *local_18;
  OperandSymbol *sym_local;
  Constructor *this_local;
  
  local_18 = sym;
  sym_local = (OperandSymbol *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"\n ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  sVar1 = std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::size(&this->operands);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  *pcVar2 = (char)sVar1 + 'A';
  std::vector<OperandSymbol_*,_std::allocator<OperandSymbol_*>_>::push_back
            (&this->operands,&local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->printpiece,(value_type *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Constructor::addOperand(OperandSymbol *sym)

{
  string operstring = "\n ";	// Indicater character for operand
  operstring[1] = ('A'+operands.size()); // Encode index of operand
  operands.push_back(sym);
  printpiece.push_back(operstring); // Placeholder for operand's string
}